

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_8_d_pcdi(void)

{
  uint *r_dst;
  uint res;
  
  m68ki_cpu.n_flag = OPER_PCDI_8();
  m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] =
       m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 0xffffff00 | m68ki_cpu.n_flag;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_d_pcdi(void)
{
	uint res = OPER_PCDI_8();
	uint* r_dst = &DX;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}